

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O0

EncoderOptionsBase<int> * __thiscall
draco::EncoderOptionsBase<int>::operator=
          (EncoderOptionsBase<int> *this,EncoderOptionsBase<int> *param_2)

{
  DracoOptions<int> *in_RSI;
  EncoderOptionsBase<int> *in_RDI;
  
  DracoOptions<int>::operator=(in_RSI,&in_RDI->super_DracoOptions<int>);
  Options::operator=(&in_RSI->global_options_,(Options *)in_RDI);
  return in_RDI;
}

Assistant:

static EncoderOptionsBase CreateDefaultOptions() {
    EncoderOptionsBase options;
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kEdgebreaker, true);
#endif
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kPredictiveEdgebreaker, true);
#endif
    return options;
  }